

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUnsetCommand.cxx
# Opt level: O3

bool __thiscall
cmUnsetCommand::InitialPass
          (cmUnsetCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  char *__s1;
  cmMakefile *pcVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *__dest;
  ulong uVar5;
  pointer pbVar6;
  pointer pbVar7;
  allocator local_51;
  string local_50;
  
  pbVar7 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (long)pbVar6 - (long)pbVar7 >> 5;
  if ((long)pbVar6 - (long)pbVar7 == 0 || 2 < uVar5) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_50);
LAB_002cba9f:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    bVar2 = false;
  }
  else {
    __s1 = (pbVar7->_M_dataplus)._M_p;
    iVar3 = strncmp(__s1,"ENV{",4);
    if (iVar3 == 0) {
      sVar4 = strlen(__s1);
      if (sVar4 < 6) goto LAB_002cb9fd;
      __dest = (char *)operator_new__(sVar4);
      sVar4 = strlen(__s1);
      strncpy(__dest,__s1 + 4,sVar4 - 5);
      sVar4 = strlen(__s1);
      __dest[sVar4 - 5] = '\0';
      cmSystemTools::UnsetEnv(__dest);
      operator_delete__(__dest);
    }
    else {
LAB_002cb9fd:
      if (uVar5 == 2) {
        iVar3 = std::__cxx11::string::compare((char *)(pbVar7 + 1));
        if (iVar3 != 0) {
          pbVar7 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pbVar6 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          goto LAB_002cba51;
        }
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::string::string((string *)&local_50,__s1,&local_51);
        cmMakefile::RemoveCacheDefinition(pcVar1,&local_50);
      }
      else {
        if (uVar5 != 1) {
LAB_002cba51:
          if ((long)pbVar6 - (long)pbVar7 == 0x40) {
            iVar3 = std::__cxx11::string::compare((char *)(pbVar7 + 1));
            if (iVar3 == 0) {
              pcVar1 = (this->super_cmCommand).Makefile;
              std::__cxx11::string::string((string *)&local_50,__s1,&local_51);
              cmMakefile::RaiseScope(pcVar1,&local_50,(char *)0x0);
              goto LAB_002cbb04;
            }
          }
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"called with an invalid second argument","");
          cmCommand::SetError(&this->super_cmCommand,&local_50);
          goto LAB_002cba9f;
        }
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::string::string((string *)&local_50,__s1,&local_51);
        cmMakefile::RemoveDefinition(pcVar1,&local_50);
      }
LAB_002cbb04:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool cmUnsetCommand::InitialPass(std::vector<std::string> const& args,
                                 cmExecutionStatus &)
{
  if(args.size() < 1 || args.size() > 2)
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  const char* variable = args[0].c_str();

  // unset(ENV{VAR})
  if (cmHasLiteralPrefix(variable, "ENV{") && strlen(variable) > 5)
    {
    // what is the variable name
    char *envVarName = new char [strlen(variable)];
    strncpy(envVarName,variable+4,strlen(variable)-5);
    envVarName[strlen(variable)-5] = '\0';

#ifdef CMAKE_BUILD_WITH_CMAKE
    cmSystemTools::UnsetEnv(envVarName);
#endif
    delete[] envVarName;
    return true;
    }
  // unset(VAR)
  else if (args.size() == 1)
    {
    this->Makefile->RemoveDefinition(variable);
    return true;
    }
  // unset(VAR CACHE)
  else if ((args.size() == 2) && (args[1] == "CACHE"))
    {
    this->Makefile->RemoveCacheDefinition(variable);
    return true;
    }
  // unset(VAR PARENT_SCOPE)
  else if ((args.size() == 2) && (args[1] == "PARENT_SCOPE"))
    {
    this->Makefile->RaiseScope(variable, 0);
    return true;
    }
  // ERROR: second argument isn't CACHE or PARENT_SCOPE
  else
    {
    this->SetError("called with an invalid second argument");
    return false;
    }
}